

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O0

int vorbis_synthesis_headerin(vorbis_info *vi,vorbis_comment *vc,ogg_packet *op)

{
  int iVar1;
  int iVar2;
  long lVar3;
  char local_56 [2];
  int packtype;
  undefined1 local_50 [2];
  char buffer [6];
  oggpack_buffer opb;
  ogg_packet *op_local;
  vorbis_comment *vc_local;
  vorbis_info *vi_local;
  
  if (op == (ogg_packet *)0x0) {
    vi_local._4_4_ = -0x85;
  }
  else {
    oggpack_readinit((oggpack_buffer *)local_50,op->packet,(int)op->bytes);
    lVar3 = oggpack_read((oggpack_buffer *)local_50,8);
    iVar1 = (int)lVar3;
    memset(local_56,0,6);
    _v_readstring((oggpack_buffer *)local_50,local_56,6);
    iVar2 = memcmp(local_56,"vorbis",6);
    if (iVar2 == 0) {
      if (iVar1 == 1) {
        if (op->b_o_s == 0) {
          vi_local._4_4_ = -0x85;
        }
        else if (vi->rate == 0) {
          vi_local._4_4_ = _vorbis_unpack_info(vi,(oggpack_buffer *)local_50);
        }
        else {
          vi_local._4_4_ = -0x85;
        }
      }
      else if (iVar1 == 3) {
        if (vi->rate == 0) {
          vi_local._4_4_ = -0x85;
        }
        else if (vc->vendor == (char *)0x0) {
          vi_local._4_4_ = _vorbis_unpack_comment(vc,(oggpack_buffer *)local_50);
        }
        else {
          vi_local._4_4_ = -0x85;
        }
      }
      else if (iVar1 == 5) {
        if ((vi->rate == 0) || (vc->vendor == (char *)0x0)) {
          vi_local._4_4_ = -0x85;
        }
        else if (vi->codec_setup == (void *)0x0) {
          vi_local._4_4_ = -0x81;
        }
        else if (*(int *)((long)vi->codec_setup + 0x20) < 1) {
          vi_local._4_4_ = _vorbis_unpack_books(vi,(oggpack_buffer *)local_50);
        }
        else {
          vi_local._4_4_ = -0x85;
        }
      }
      else {
        vi_local._4_4_ = -0x85;
      }
    }
    else {
      vi_local._4_4_ = -0x84;
    }
  }
  return vi_local._4_4_;
}

Assistant:

int vorbis_synthesis_headerin(vorbis_info *vi,vorbis_comment *vc,ogg_packet *op){
  oggpack_buffer opb;

  if(op){
    oggpack_readinit(&opb,op->packet,op->bytes);

    /* Which of the three types of header is this? */
    /* Also verify header-ness, vorbis */
    {
      char buffer[6];
      int packtype=oggpack_read(&opb,8);
      memset(buffer,0,6);
      _v_readstring(&opb,buffer,6);
      if(memcmp(buffer,"vorbis",6)){
        /* not a vorbis header */
        return(OV_ENOTVORBIS);
      }
      switch(packtype){
      case 0x01: /* least significant *bit* is read first */
        if(!op->b_o_s){
          /* Not the initial packet */
          return(OV_EBADHEADER);
        }
        if(vi->rate!=0){
          /* previously initialized info header */
          return(OV_EBADHEADER);
        }

        return(_vorbis_unpack_info(vi,&opb));

      case 0x03: /* least significant *bit* is read first */
        if(vi->rate==0){
          /* um... we didn't get the initial header */
          return(OV_EBADHEADER);
        }
        if(vc->vendor!=NULL){
          /* previously initialized comment header */
          return(OV_EBADHEADER);
        }

        return(_vorbis_unpack_comment(vc,&opb));

      case 0x05: /* least significant *bit* is read first */
        if(vi->rate==0 || vc->vendor==NULL){
          /* um... we didn;t get the initial header or comments yet */
          return(OV_EBADHEADER);
        }
        if(vi->codec_setup==NULL){
          /* improperly initialized vorbis_info */
          return(OV_EFAULT);
        }
        if(((codec_setup_info *)vi->codec_setup)->books>0){
          /* previously initialized setup header */
          return(OV_EBADHEADER);
        }

        return(_vorbis_unpack_books(vi,&opb));

      default:
        /* Not a valid vorbis header type */
        return(OV_EBADHEADER);
        break;
      }
    }
  }
  return(OV_EBADHEADER);
}